

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O0

_Bool bin_init(bin_t *bin)

{
  _Bool _Var1;
  char *in_RDI;
  malloc_mutex_lock_order_t in_stack_ffffffffffffffe8;
  witness_rank_t in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  _Var1 = malloc_mutex_init((malloc_mutex_t *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                            in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  if (!_Var1) {
    in_RDI[0x70] = '\0';
    in_RDI[0x71] = '\0';
    in_RDI[0x72] = '\0';
    in_RDI[0x73] = '\0';
    in_RDI[0x74] = '\0';
    in_RDI[0x75] = '\0';
    in_RDI[0x76] = '\0';
    in_RDI[0x77] = '\0';
    extent_heap_new((extent_heap_t *)0x12ab69);
    extent_list_init((extent_list_t *)(in_RDI + 0x80));
    memset(in_RDI + 0x88,0,0x90);
  }
  return _Var1;
}

Assistant:

bool
bin_init(bin_t *bin) {
	if (malloc_mutex_init(&bin->lock, "bin", WITNESS_RANK_BIN,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	bin->slabcur = NULL;
	extent_heap_new(&bin->slabs_nonfull);
	extent_list_init(&bin->slabs_full);
	if (config_stats) {
		memset(&bin->stats, 0, sizeof(bin_stats_t));
	}
	return false;
}